

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,REF_INT *face_nodes)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  REF_CELL pRVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  REF_BOOL complete;
  REF_DBL t;
  REF_DBL uvw [3];
  int local_9c;
  REF_INT *local_98;
  long local_90;
  REF_GRID local_88;
  REF_CELL local_80;
  ulong local_78;
  ulong local_70;
  double local_68;
  REF_NODE local_60;
  double local_58;
  double local_50;
  double dStack_48;
  long local_38;
  
  local_60 = ref_grid->node;
  pRVar14 = ref_grid->cell[8];
  uVar13 = *face_nodes;
  uVar17 = face_nodes[1];
  local_98 = face_nodes;
  local_88 = ref_grid;
  if (((-1 < (long)(int)uVar13) && (pRVar1 = pRVar14->ref_adj, (int)uVar13 < pRVar1->nnode)) &&
     (uVar12 = (ulong)pRVar1->first[(int)uVar13], uVar12 != -1)) {
    pRVar2 = pRVar1->item + uVar12;
    iVar7 = pRVar14->node_per;
    local_90 = CONCAT44(local_90._4_4_,uVar17);
    do {
      if (0 < iVar7) {
        local_80 = (REF_CELL)(long)pRVar2->ref;
        local_78 = 0;
        local_70 = uVar12;
        do {
          if ((uVar17 == pRVar14->c2n[pRVar14->size_per * (int)local_80 + (int)local_78]) &&
             (0 < pRVar14->edge_per)) {
            lVar11 = 0;
            do {
              lVar9 = (long)pRVar14->size_per * (long)local_80;
              uVar15 = pRVar14->c2n[pRVar14->e2n[lVar11 * 2] + lVar9];
              if (((uVar15 != uVar13) &&
                  (uVar8 = pRVar14->c2n[(long)(int)lVar9 + (long)pRVar14->e2n[lVar11 * 2 + 1]],
                  uVar8 != uVar13)) && ((uVar15 != uVar17 && (uVar8 != uVar17)))) {
                uVar6 = ref_node_tri_seg_intersection
                                  (local_60,uVar15,uVar8,local_98,&local_68,&local_58);
                if (uVar6 != 0) {
                  pcVar16 = "int";
                  uVar10 = 0x382;
                  goto LAB_001e8b21;
                }
                auVar3._4_4_ = -(uint)(local_58 <= 0.0);
                auVar3._0_4_ = -(uint)(local_68 <= 0.0);
                auVar3._8_4_ = -(uint)(local_50 <= 0.0);
                auVar3._12_4_ = -(uint)(dStack_48 <= 0.0);
                iVar7 = movmskps(0,auVar3);
                uVar17 = (uint)local_90;
                if ((iVar7 == 0) && (local_68 < 1.0)) {
                  printf("t %f u %f v %f w %f \n");
                  uVar6 = ref_layer_swap(local_88,uVar15,uVar8,*local_98,&local_9c);
                  if (uVar6 != 0) {
                    pcVar16 = "n0";
                    uVar10 = 0x386;
                    goto LAB_001e8b21;
                  }
                  uVar17 = (uint)local_90;
                  if (local_9c != 0) break;
                  uVar6 = ref_layer_swap(local_88,uVar15,uVar8,local_98[1],&local_9c);
                  if (uVar6 != 0) {
                    pcVar16 = "n1";
                    uVar10 = 0x389;
                    goto LAB_001e8b21;
                  }
                  uVar17 = (uint)local_90;
                  if (local_9c != 0) break;
                  uVar6 = ref_layer_swap(local_88,uVar15,uVar8,local_98[2],&local_9c);
                  if (uVar6 != 0) {
                    pcVar16 = "n2";
                    uVar10 = 0x38c;
                    goto LAB_001e8b21;
                  }
                  uVar17 = (uint)local_90;
                  if (local_9c != 0) break;
                  puts("nothing ");
                }
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pRVar14->edge_per);
            iVar7 = pRVar14->node_per;
            uVar12 = local_70;
          }
          uVar15 = (int)local_78 + 1;
          local_78 = (ulong)uVar15;
        } while ((int)uVar15 < iVar7);
      }
      pRVar2 = pRVar14->ref_adj->item;
      uVar12 = (ulong)pRVar2[(int)uVar12].next;
      if (uVar12 == -1) goto LAB_001e8808;
      pRVar2 = pRVar2 + uVar12;
    } while( true );
  }
LAB_001e8811:
  uVar13 = local_98[2];
  local_80 = pRVar14;
  if (((-1 < (int)uVar17) && (pRVar1 = pRVar14->ref_adj, (int)uVar17 < pRVar1->nnode)) &&
     (uVar12 = (ulong)pRVar1->first[uVar17], uVar12 != -1)) {
    pRVar2 = pRVar1->item + uVar12;
    iVar7 = pRVar14->node_per;
    do {
      if (0 < iVar7) {
        local_90 = (long)pRVar2->ref;
        local_78 = 0;
        local_70 = uVar12;
        do {
          if ((uVar13 == pRVar14->c2n[(int)(pRVar14->size_per * (uint)local_90 + (int)local_78)]) &&
             (0 < pRVar14->edge_per)) {
            lVar11 = 0;
            do {
              lVar9 = local_80->size_per * local_90;
              uVar15 = local_80->c2n[local_80->e2n[lVar11 * 2] + lVar9];
              if (((uVar15 != uVar17) &&
                  (uVar8 = local_80->c2n[(long)(int)lVar9 + (long)local_80->e2n[lVar11 * 2 + 1]],
                  uVar8 != uVar17)) && ((uVar15 != uVar13 && (uVar8 != uVar13)))) {
                uVar6 = ref_node_tri_seg_intersection
                                  (local_60,uVar15,uVar8,local_98,&local_68,&local_58);
                if (uVar6 != 0) {
                  pcVar16 = "int";
                  uVar10 = 0x39e;
                  goto LAB_001e8b21;
                }
                auVar4._4_4_ = -(uint)(local_58 <= 0.0);
                auVar4._0_4_ = -(uint)(local_68 <= 0.0);
                auVar4._8_4_ = -(uint)(local_50 <= 0.0);
                auVar4._12_4_ = -(uint)(dStack_48 <= 0.0);
                iVar7 = movmskps(0,auVar4);
                if ((iVar7 == 0) && (local_68 < 1.0)) {
                  printf("t %f u %f v %f w %f \n");
                  uVar6 = ref_layer_swap(local_88,uVar15,uVar8,*local_98,&local_9c);
                  if (uVar6 != 0) {
                    pcVar16 = "n0";
                    uVar10 = 0x3a2;
LAB_001e8b21:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,uVar10,"ref_layer_recover_face",(ulong)uVar6,pcVar16);
                    return uVar6;
                  }
                  if (local_9c != 0) break;
                  uVar6 = ref_layer_swap(local_88,uVar15,uVar8,local_98[1],&local_9c);
                  if (uVar6 != 0) {
                    pcVar16 = "n1";
                    uVar10 = 0x3a5;
                    goto LAB_001e8b21;
                  }
                  if (local_9c != 0) break;
                  uVar6 = ref_layer_swap(local_88,uVar15,uVar8,local_98[2],&local_9c);
                  if (uVar6 != 0) {
                    pcVar16 = "n2";
                    uVar10 = 0x3a8;
                    goto LAB_001e8b21;
                  }
                  if (local_9c != 0) break;
                  puts("nothing ");
                }
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_80->edge_per);
            iVar7 = local_80->node_per;
            uVar12 = local_70;
            pRVar14 = local_80;
          }
          uVar15 = (int)local_78 + 1;
          local_78 = (ulong)uVar15;
        } while ((int)uVar15 < iVar7);
      }
      pRVar2 = pRVar14->ref_adj->item;
      uVar12 = (ulong)pRVar2[(int)uVar12].next;
      if (uVar12 == -1) goto LAB_001e8b30;
      pRVar2 = pRVar2 + uVar12;
    } while( true );
  }
LAB_001e8b38:
  if ((((int)uVar13 < 0) || (pRVar1 = pRVar14->ref_adj, pRVar1->nnode <= (int)uVar13)) ||
     (lVar11 = (long)pRVar1->first[uVar13], lVar11 == -1)) {
    return 0;
  }
  local_90 = CONCAT44(local_90._4_4_,*local_98);
  pRVar2 = pRVar1->item + lVar11;
  iVar7 = pRVar14->node_per;
  do {
    if (0 < iVar7) {
      local_78 = (ulong)pRVar2->ref;
      local_70 = 0;
      local_38 = lVar11;
      do {
        if (((uint)local_90 == pRVar14->c2n[pRVar14->size_per * (int)local_78 + (int)local_70]) &&
           (0 < pRVar14->edge_per)) {
          lVar11 = 0;
          do {
            lVar9 = (long)local_80->size_per * local_78;
            uVar17 = local_80->c2n[local_80->e2n[lVar11 * 2] + lVar9];
            if (((uVar17 != uVar13) &&
                (uVar15 = local_80->c2n[(long)(int)lVar9 + (long)local_80->e2n[lVar11 * 2 + 1]],
                uVar15 != uVar13)) && ((uVar17 != (uint)local_90 && (uVar15 != (uint)local_90)))) {
              uVar8 = ref_node_tri_seg_intersection
                                (local_60,uVar17,uVar15,local_98,&local_68,&local_58);
              if (uVar8 != 0) {
                pcVar16 = "int";
                uVar10 = 0x3ba;
                goto LAB_001e8e3d;
              }
              auVar5._4_4_ = -(uint)(local_58 <= 0.0);
              auVar5._0_4_ = -(uint)(local_68 <= 0.0);
              auVar5._8_4_ = -(uint)(local_50 <= 0.0);
              auVar5._12_4_ = -(uint)(dStack_48 <= 0.0);
              iVar7 = movmskps(0,auVar5);
              if ((iVar7 == 0) && (local_68 < 1.0)) {
                printf("t %f u %f v %f w %f \n");
                uVar8 = ref_layer_swap(local_88,uVar17,uVar15,*local_98,&local_9c);
                if (uVar8 != 0) {
                  pcVar16 = "n0";
                  uVar10 = 0x3be;
LAB_001e8e3d:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,uVar10,"ref_layer_recover_face",(ulong)uVar8,pcVar16);
                  return uVar8;
                }
                if (local_9c != 0) break;
                uVar8 = ref_layer_swap(local_88,uVar17,uVar15,local_98[1],&local_9c);
                if (uVar8 != 0) {
                  pcVar16 = "n1";
                  uVar10 = 0x3c1;
                  goto LAB_001e8e3d;
                }
                if (local_9c != 0) break;
                uVar8 = ref_layer_swap(local_88,uVar17,uVar15,local_98[2],&local_9c);
                if (uVar8 != 0) {
                  pcVar16 = "n2";
                  uVar10 = 0x3c4;
                  goto LAB_001e8e3d;
                }
                if (local_9c != 0) break;
                puts("nothing ");
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_80->edge_per);
          iVar7 = local_80->node_per;
          lVar11 = local_38;
          pRVar14 = local_80;
        }
        uVar17 = (int)local_70 + 1;
        local_70 = (ulong)uVar17;
      } while ((int)uVar17 < iVar7);
    }
    pRVar2 = pRVar14->ref_adj->item;
    lVar11 = (long)pRVar2[(int)lVar11].next;
    if (lVar11 == -1) {
      return 0;
    }
    pRVar2 = pRVar2 + lVar11;
  } while( true );
LAB_001e8808:
  uVar17 = local_98[1];
  goto LAB_001e8811;
LAB_001e8b30:
  uVar13 = local_98[2];
  goto LAB_001e8b38;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,
                                                 REF_INT *face_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT face_node0, face_node1, item, cell_node, cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL t, uvw[3];
  REF_BOOL complete;
  face_node0 = face_nodes[0];
  face_node1 = face_nodes[1];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[1];
  face_node1 = face_nodes[2];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[2];
  face_node1 = face_nodes[0];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  return REF_SUCCESS;
}